

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_meshb(REF_GRID ref_grid,char *filename)

{
  REF_GEOM ref_geom_00;
  REF_SIZE RVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  int local_20c;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL pad;
  REF_INT faceid;
  REF_BOOL select_faceid;
  REF_BOOL sixty_four_bit;
  REF_BOOL swap_endian;
  REF_BOOL always_id;
  REF_BOOL faceid_insted_of_c2n;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT type;
  REF_INT ngeom;
  REF_INT node_per;
  REF_LONG ncell;
  REF_INT fp_size;
  REF_INT int_size;
  REF_INT header_size;
  REF_INT keyword_code;
  REF_FILEPOS next_position;
  int local_40;
  REF_INT dim;
  REF_INT version;
  REF_INT code;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  _version = ref_grid->node;
  _header_size = 0;
  ref_geom_00 = ref_grid->geom;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  uVar2 = ref_node_synchronize_globals(_version);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x8c5,
           "ref_gather_meshb",(ulong)uVar2,"sync");
    return uVar2;
  }
  next_position._4_4_ = 3;
  if (*(int *)(filename_local + 0x108) != 0) {
    next_position._4_4_ = 2;
  }
  local_40 = 2;
  if (*(int *)(filename_local + 0xc4) < 2) {
    if (10000000 < _version->old_n_global) {
      local_40 = 3;
    }
    if (200000000 < _version->old_n_global) {
      local_40 = 4;
    }
  }
  else {
    local_40 = *(int *)(filename_local + 0xc4);
  }
  faceid = (REF_INT)(3 < local_40);
  ncell._4_4_ = 4;
  ncell._0_4_ = 4;
  if (2 < local_40) {
    ncell._0_4_ = 8;
  }
  if (3 < local_40) {
    ncell._4_4_ = 8;
  }
  fp_size = (int)ncell + 4 + ncell._4_4_;
  ref_node = (REF_NODE)0x0;
  if (*(int *)(*(long *)filename_local + 4) == 0) {
    ref_node = (REF_NODE)fopen((char *)file,"w");
    if ((FILE *)ref_node == (FILE *)0x0) {
      printf("unable to open %s\n",file);
    }
    if (ref_node == (REF_NODE)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8de,"ref_gather_meshb","unable to open file");
      return 2;
    }
    dim = 1;
    sVar4 = fwrite(&dim,4,1,(FILE *)ref_node);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e1,"ref_gather_meshb","code",1,sVar4);
      return 1;
    }
    sVar4 = fwrite(&local_40,4,1,(FILE *)ref_node);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e2,"ref_gather_meshb","version",1,sVar4);
      return 1;
    }
    iVar3 = (int)ncell + 8;
    _header_size = ftell((FILE *)ref_node);
    _header_size = iVar3 + _header_size;
    int_size = 3;
    sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e6,"ref_gather_meshb","dim code",1,sVar4);
      return 1;
    }
    uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,_header_size);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e7,"ref_gather_meshb",(ulong)uVar2,"next p");
      return uVar2;
    }
    sVar4 = fwrite((void *)((long)&next_position + 4),4,1,(FILE *)ref_node);
    lVar6 = _header_size;
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e8,"ref_gather_meshb","dim",1,sVar4);
      return 1;
    }
    lVar5 = ftell((FILE *)ref_node);
    if (lVar6 != lVar5) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8e9,"ref_gather_meshb","dim inconsistent",lVar6,lVar5);
      return 1;
    }
  }
  if (*(int *)(*(long *)filename_local + 4) == 0) {
    lVar5 = (long)fp_size;
    lVar6 = _version->old_n_global;
    iVar3 = next_position._4_4_ * 8 + ncell._4_4_;
    _header_size = ftell((FILE *)ref_node);
    _header_size = lVar5 + lVar6 * iVar3 + _header_size;
    int_size = 4;
    sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
    if (sVar4 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8f2,"ref_gather_meshb","vertex version code",1,sVar4);
      return 1;
    }
    uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,_header_size);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8f3,"ref_gather_meshb",(ulong)uVar2,"next p");
      return uVar2;
    }
    uVar2 = ref_gather_meshb_glob((FILE *)ref_node,local_40,_version->old_n_global);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8f5,"ref_gather_meshb",(ulong)uVar2,"nnode");
      return uVar2;
    }
  }
  ref_grid_local._4_4_ =
       ref_gather_node(_version,0,local_40,*(REF_BOOL *)(filename_local + 0x108),(FILE *)ref_node);
  lVar6 = _header_size;
  if (ref_grid_local._4_4_ == 0) {
    if ((*(int *)(*(long *)filename_local + 4) == 0) &&
       (lVar5 = ftell((FILE *)ref_node), lVar6 != lVar5)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x8fb,"ref_gather_meshb","vertex inconsistent",lVar6,lVar5);
      ref_grid_local._4_4_ = 1;
    }
    else {
      ref_cell._0_4_ = 0;
      ref_geom = *(REF_GEOM *)(filename_local + 0x10);
      while ((int)ref_cell < 0x10) {
        uVar2 = ref_cell_ncell((REF_CELL)ref_geom,_version,(REF_LONG *)&ngeom);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x8fe,"ref_gather_meshb",(ulong)uVar2,"ncell");
          return uVar2;
        }
        if (0 < _ngeom) {
          if (*(int *)(*(long *)filename_local + 4) == 0) {
            uVar2 = ref_cell_meshb_keyword((REF_CELL)ref_geom,&int_size);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x901,"ref_gather_meshb",(ulong)uVar2,"kw");
              return uVar2;
            }
            type = *(REF_INT *)&ref_geom->field_0xc;
            lVar6 = ftell((FILE *)ref_node);
            _header_size = lVar6 + fp_size + _ngeom * (ncell._4_4_ * (type + 1));
            sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
            if (sVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x906,"ref_gather_meshb","keyword code",1,sVar4);
              return 1;
            }
            uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,_header_size);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x908,"ref_gather_meshb",(ulong)uVar2,"next");
              return uVar2;
            }
            uVar2 = ref_gather_meshb_glob((FILE *)ref_node,local_40,_ngeom);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x909,"ref_gather_meshb",(ulong)uVar2,"ncell");
              return uVar2;
            }
          }
          uVar2 = ref_gather_cell(_version,(REF_CELL)ref_geom,0,1,0,faceid,0,-1,0,(FILE *)ref_node);
          lVar6 = _header_size;
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x90e,"ref_gather_meshb",(ulong)uVar2,"nodes");
            return uVar2;
          }
          if ((*(int *)(*(long *)filename_local + 4) == 0) &&
             (lVar5 = ftell((FILE *)ref_node), lVar6 != lVar5)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x910,"ref_gather_meshb","cell inconsistent",lVar6,lVar5);
            return 1;
          }
        }
        ref_cell._0_4_ = (int)ref_cell + 1;
        ref_geom = *(REF_GEOM *)(filename_local + (long)(int)ref_cell * 8 + 0x10);
      }
      for (ref_cell._4_4_ = 0; ref_cell._4_4_ < 3; ref_cell._4_4_ = ref_cell._4_4_ + 1) {
        int_size = ref_cell._4_4_ + 0x28;
        uVar2 = ref_gather_ngeom(_version,ref_geom_00,ref_cell._4_4_,&group);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x916,"ref_gather_meshb",(ulong)uVar2,"ngeom");
          return uVar2;
        }
        if (0 < group) {
          if (*(int *)(*(long *)filename_local + 4) == 0) {
            lVar6 = (long)fp_size;
            lVar5 = (long)group;
            iVar3 = ncell._4_4_ * 2;
            if (ref_cell._4_4_ < 1) {
              local_20c = 0;
            }
            else {
              local_20c = group << 3;
            }
            _header_size = ftell((FILE *)ref_node);
            _header_size = lVar6 + lVar5 * (iVar3 + ref_cell._4_4_ * 8) + (long)local_20c +
                           _header_size;
            sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
            if (sVar4 != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x91e,"ref_gather_meshb","vertex version code",1,sVar4);
              return 1;
            }
            uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,_header_size);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x91f,"ref_gather_meshb",(ulong)uVar2,"np");
              return uVar2;
            }
            uVar2 = ref_gather_meshb_int((FILE *)ref_node,local_40,group);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x920,"ref_gather_meshb",(ulong)uVar2,"ngeom");
              return uVar2;
            }
          }
          uVar2 = ref_gather_geom(_version,ref_geom_00,local_40,ref_cell._4_4_,(FILE *)ref_node);
          lVar6 = _header_size;
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x922,"ref_gather_meshb",(ulong)uVar2,"nodes");
            return uVar2;
          }
          if ((*(int *)(*(long *)filename_local + 4) == 0) &&
             (lVar5 = ftell((FILE *)ref_node), lVar6 != lVar5)) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x924,"ref_gather_meshb","geom inconsistent",lVar6,lVar5);
            return 1;
          }
        }
      }
      if ((*(int *)(*(long *)filename_local + 4) == 0) && (ref_geom_00->cad_data_size != 0)) {
        int_size = 0x7e;
        lVar6 = (long)fp_size;
        RVar1 = ref_geom_00->cad_data_size;
        _header_size = ftell((FILE *)ref_node);
        _header_size = lVar6 + RVar1 + _header_size;
        sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
        if (sVar4 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x92c,"ref_gather_meshb","keyword",1,sVar4);
          return 1;
        }
        uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,_header_size);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x92d,"ref_gather_meshb",(ulong)uVar2,"next p");
          return uVar2;
        }
        uVar2 = ref_gather_meshb_size((FILE *)ref_node,local_40,ref_geom_00->cad_data_size);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x92f,"ref_gather_meshb",(ulong)uVar2,"cad size");
          return uVar2;
        }
        RVar1 = ref_geom_00->cad_data_size;
        sVar4 = fwrite(ref_geom_00->cad_data,1,ref_geom_00->cad_data_size,(FILE *)ref_node);
        lVar6 = _header_size;
        if (RVar1 != sVar4) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x933,"ref_gather_meshb","node",RVar1,sVar4);
          return 1;
        }
        lVar5 = ftell((FILE *)ref_node);
        if (lVar6 != lVar5) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x934,"ref_gather_meshb","cad_model inconsistent",lVar6,lVar5);
          return 1;
        }
      }
      if (*(int *)(*(long *)filename_local + 4) == 0) {
        int_size = 0x36;
        sVar4 = fwrite(&int_size,4,1,(FILE *)ref_node);
        if (sVar4 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x939,"ref_gather_meshb","vertex version code",1,sVar4);
          return 1;
        }
        _header_size = 0;
        uVar2 = ref_export_meshb_next_position((FILE *)ref_node,local_40,0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x93b,"ref_gather_meshb",(ulong)uVar2,"next p");
          return uVar2;
        }
        fclose((FILE *)ref_node);
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x8f9,
           "ref_gather_meshb",(ulong)ref_grid_local._4_4_,"nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT code, version, dim;
  REF_FILEPOS next_position = 0;
  REF_INT keyword_code, header_size, int_size, fp_size;
  REF_LONG ncell;
  REF_INT node_per;
  REF_INT ngeom, type, group;
  REF_CELL ref_cell;
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL faceid_insted_of_c2n = REF_FALSE;
  REF_BOOL always_id = REF_TRUE;
  REF_BOOL swap_endian = REF_FALSE;
  REF_BOOL sixty_four_bit = REF_FALSE;
  REF_BOOL select_faceid = REF_FALSE;
  REF_INT faceid = REF_EMPTY;
  REF_BOOL pad = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  dim = 3;
  if (ref_grid_twod(ref_grid)) dim = 2;

  version = 2;
  if (1 < ref_grid_meshb_version(ref_grid)) {
    version = ref_grid_meshb_version(ref_grid);
  } else {
    if (REF_EXPORT_MESHB_VERTEX_3 < ref_node_n_global(ref_node)) version = 3;
    if (REF_EXPORT_MESHB_VERTEX_4 < ref_node_n_global(ref_node)) version = 4;
  }

  if (4 <= version) sixty_four_bit = REF_TRUE;

  int_size = 4;
  fp_size = 4;
  if (2 < version) fp_size = 8;
  if (3 < version) int_size = 8;
  header_size = 4 + fp_size + int_size;

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    code = 1;
    REIS(1, fwrite(&code, sizeof(int), 1, file), "code");
    REIS(1, fwrite(&version, sizeof(int), 1, file), "version");
    /* dimension keyword always int */
    next_position = (REF_FILEPOS)(4 + fp_size + 4) + ftell(file);
    keyword_code = 3;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "dim code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    REIS(1, fwrite(&dim, sizeof(int), 1, file), "dim");
    REIS(next_position, ftell(file), "dim inconsistent");
  }

  if (ref_grid_once(ref_grid)) {
    next_position = (REF_FILEPOS)header_size +
                    (REF_FILEPOS)ref_node_n_global(ref_node) *
                        (REF_FILEPOS)(dim * 8 + int_size) +
                    ftell(file);
    keyword_code = 4;
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_gather_meshb_glob(file, version, ref_node_n_global(ref_node)),
        "nnode");
  }
  RSS(ref_gather_node(ref_node, swap_endian, version, ref_grid_twod(ref_grid),
                      file),
      "nodes");
  if (ref_grid_once(ref_grid))
    REIS(next_position, ftell(file), "vertex inconsistent");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_ncell(ref_cell, ref_node, &ncell), "ncell");
    if (ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
        node_per = ref_cell_node_per(ref_cell);
        next_position =
            ftell(file) + (REF_FILEPOS)header_size +
            (REF_FILEPOS)ncell * (REF_FILEPOS)(int_size * (node_per + 1));
        REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword code");
        RSS(ref_export_meshb_next_position(file, version, next_position),
            "next");
        RSS(ref_gather_meshb_glob(file, version, ncell), "ncell");
      }
      RSS(ref_gather_cell(ref_node, ref_cell, faceid_insted_of_c2n, always_id,
                          swap_endian, sixty_four_bit, select_faceid, faceid,
                          pad, file),
          "nodes");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    keyword_code = 40 + type; /* GmfVerticesOnGeometricVertices */
    RSS(ref_gather_ngeom(ref_node, ref_geom, type, &ngeom), "ngeom");
    if (ngeom > 0) {
      if (ref_grid_once(ref_grid)) {
        next_position =
            (REF_FILEPOS)header_size +
            (REF_FILEPOS)ngeom * (REF_FILEPOS)(int_size * 2 + 8 * type) +
            (0 < type ? 8 * ngeom : 0) + ftell(file);
        REIS(1, fwrite(&keyword_code, sizeof(int), 1, file),
             "vertex version code");
        RSS(ref_export_meshb_next_position(file, version, next_position), "np");
        RSS(ref_gather_meshb_int(file, version, ngeom), "ngeom");
      }
      RSS(ref_gather_geom(ref_node, ref_geom, version, type, file), "nodes");
      if (ref_grid_once(ref_grid))
        REIS(next_position, ftell(file), "geom inconsistent");
    }
  }

  if (ref_grid_once(ref_grid) && 0 < ref_geom_cad_data_size(ref_geom)) {
    keyword_code = 126; /* GmfByteFlow */
    next_position = (REF_FILEPOS)header_size +
                    (REF_FILEPOS)ref_geom_cad_data_size(ref_geom) + ftell(file);
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "keyword");
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    RSS(ref_gather_meshb_size(file, version, ref_geom_cad_data_size(ref_geom)),
        "cad size");
    REIS(ref_geom_cad_data_size(ref_geom),
         fwrite(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
                (size_t)ref_geom_cad_data_size(ref_geom), file),
         "node");
    REIS(next_position, ftell(file), "cad_model inconsistent");
  }

  if (ref_grid_once(ref_grid)) { /* End */
    keyword_code = 54;           /* GmfEnd 101-47 */
    REIS(1, fwrite(&keyword_code, sizeof(int), 1, file), "vertex version code");
    next_position = 0;
    RSS(ref_export_meshb_next_position(file, version, next_position), "next p");
    fclose(file);
  }

  return REF_SUCCESS;
}